

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,UntypedMapBase *map)

{
  byte bVar1;
  TypeInfo TVar2;
  undefined4 uVar3;
  TcParseTableBase *pTVar4;
  int32_t iVar5;
  bool bVar6;
  uint32_t size;
  Nonnull<const_char_*> failure_msg;
  ushort *puVar7;
  char *extraout_RDX;
  pointer pcVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char *file;
  uint uVar12;
  int iVar13;
  pointer pcVar14;
  string *s;
  uint uVar15;
  string_view sVar16;
  string_view sVar17;
  string_view message_name;
  string_view field_name;
  undefined1 in_stack_ffffffffffffff58;
  ushort *local_98;
  MapTypeCard local_8a;
  uint32_t inner_tag;
  int local_84;
  LogMessageFatal local_80;
  uint local_6c;
  uint local_68;
  int local_64;
  uint local_60;
  LimitToken local_5c;
  NodeBase *local_58;
  TcParseTableBase *local_50;
  FieldEntry *local_48;
  FieldAux *local_40;
  string *local_38;
  
  iVar5 = (aux->enum_range).last;
  local_60 = (uint)(ushort)(aux->map_info).key_type_card;
  uVar15 = local_60 & 0xff;
  local_6c = (uint)(ushort)(aux->map_info).value_type_card;
  local_68 = local_6c & 0xff;
  local_38 = (string *)(node + 1);
  local_98 = (ushort *)ptr;
  local_58 = node;
  local_50 = table;
  local_48 = entry;
  local_40 = aux;
  do {
    while( true ) {
      bVar6 = ParseContext::Done(ctx,(char **)&local_98);
      if (bVar6) {
        return (char *)local_98;
      }
      inner_tag = (uint32_t)(char)*local_98;
      if (inner_tag == local_68 || inner_tag == uVar15) break;
      local_98 = (ushort *)ReadTag((char *)local_98,&inner_tag,0);
      if (inner_tag == local_68 || inner_tag == uVar15) goto LAB_001cd77a;
      if (local_98 == (ushort *)0x0) {
        return (char *)(ushort *)0x0;
      }
      if ((inner_tag == 0) || ((inner_tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = inner_tag - 1;
        return (char *)local_98;
      }
      local_98 = (ushort *)UnknownFieldParse(inner_tag,(string *)0x0,(char *)local_98,ctx);
joined_r0x001cdb3c:
      if (local_98 == (ushort *)0x0) {
        return (char *)(ushort *)0x0;
      }
    }
    local_98 = (ushort *)((long)local_98 + 1);
LAB_001cd77a:
    TVar2 = map->type_info_;
    if (inner_tag == uVar15) {
      uVar10 = (uint)(TVar2._3_1_ & 0xf);
      local_8a = SUB42(local_60,0);
      s = local_38;
    }
    else {
      uVar10 = (uint)TVar2 >> 0x1c;
      s = (string *)((long)&node->next + (ulong)((uint)TVar2 >> 0x10 & 0xff));
      local_8a = SUB42(local_6c,0);
    }
    switch(inner_tag & 7) {
    case 0:
      pcVar14 = (pointer)(long)(char)*local_98;
      if ((long)pcVar14 < 0) {
        uVar9 = (long)*(char *)((long)local_98 + 1) << 7 | 0x7f;
        if ((long)uVar9 < 0) {
          uVar11 = (long)(char)local_98[1] << 0xe | 0x3fff;
          if ((long)uVar11 < 0) {
            uVar9 = uVar9 & ((long)*(char *)((long)local_98 + 3) << 0x15 | 0x1fffffU);
            if ((long)uVar9 < 0) {
              uVar11 = uVar11 & ((long)(char)local_98[2] << 0x1c | 0xfffffffU);
              if ((long)uVar11 < 0) {
                uVar9 = uVar9 & ((long)*(char *)((long)local_98 + 5) << 0x23 | 0x7ffffffffU);
                if ((long)uVar9 < 0) {
                  uVar11 = uVar11 & ((long)(char)local_98[3] << 0x2a | 0x3ffffffffffU);
                  if ((long)uVar11 < 0) {
                    uVar9 = uVar9 & ((long)*(char *)((long)local_98 + 7) << 0x31 | 0x1ffffffffffffU)
                    ;
                    if ((long)uVar9 < 0) {
                      uVar11 = uVar11 & ((ulong)(byte)local_98[4] << 0x38 | 0xffffffffffffff);
                      if ((long)uVar11 < 0) {
                        bVar1 = *(byte *)((long)local_98 + 9);
                        local_98 = local_98 + 5;
                        if (bVar1 != 1) {
                          if ((char)bVar1 < '\0') {
                            return (char *)(ushort *)0x0;
                          }
                          if ((bVar1 & 1) == 0) {
                            uVar11 = uVar11 ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        local_98 = (ushort *)((long)local_98 + 9);
                      }
                    }
                    else {
                      local_98 = local_98 + 4;
                    }
                  }
                  else {
                    local_98 = (ushort *)((long)local_98 + 7);
                  }
                }
                else {
                  local_98 = local_98 + 3;
                }
              }
              else {
                local_98 = (ushort *)((long)local_98 + 5);
              }
            }
            else {
              local_98 = local_98 + 2;
            }
          }
          else {
            local_98 = (ushort *)((long)local_98 + 3);
          }
          uVar9 = uVar9 & uVar11;
        }
        else {
          local_98 = local_98 + 1;
        }
        pcVar14 = (pointer)((ulong)pcVar14 & uVar9);
      }
      else {
        local_98 = (ushort *)((long)local_98 + 1);
      }
      uVar12 = (uint)pcVar14;
      if ((char)uVar10 == '\x02') {
        bVar6 = MapTypeCard::is_zigzag(&local_8a);
        pcVar8 = (pointer)(-(ulong)(uVar12 & 1) ^ (ulong)pcVar14 >> 1);
        if (!bVar6) {
          pcVar8 = pcVar14;
        }
        (s->_M_dataplus)._M_p = pcVar8;
      }
      else if (uVar10 == 1) {
        bVar6 = MapTypeCard::is_zigzag(&local_8a);
        uVar10 = -(uVar12 & 1) ^ (uint)((ulong)pcVar14 >> 1) & 0x7fffffff;
        if (!bVar6) {
          uVar10 = uVar12;
        }
        *(uint *)&(s->_M_dataplus)._M_p = uVar10;
      }
      else {
        if (uVar10 != 0) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xad6);
        }
        *(bool *)&(s->_M_dataplus)._M_p = pcVar14 != (pointer)0x0;
      }
      break;
    case 1:
      pcVar14 = *(pointer *)local_98;
      local_98 = local_98 + 4;
      (s->_M_dataplus)._M_p = pcVar14;
      break;
    case 2:
      if ((char)uVar10 != '\x05') {
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                (uVar10,6,
                                 "static_cast<int>(type_kind) == static_cast<int>(UntypedMapBase::TypeKind::kMessage)"
                                );
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
          ;
          iVar13 = 0xaf4;
          goto LAB_001cdce1;
        }
        local_80.super_LogMessage.errno_saver_.saved_errno_ = inner_tag;
        local_84 = CONCAT31(local_84._1_3_,(char)local_6c);
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                                ((uint *)&local_80,(uchar *)&local_84,"inner_tag == value_tag");
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
          ;
          iVar13 = 0xaf5;
          goto LAB_001cdce1;
        }
        local_80.super_LogMessage._0_8_ = local_98;
        ReadSize((char **)&local_80);
        if ((ushort *)local_80.super_LogMessage._0_8_ == (ushort *)0x0) {
          return (char *)(ushort *)0x0;
        }
        if (ctx->depth_ < 1) {
          return (char *)(ushort *)0x0;
        }
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&local_84,(char *)ctx,
                   local_80.super_LogMessage.errno_saver_.saved_errno_);
        iVar13 = ctx->depth_ + -1;
        ctx->depth_ = iVar13;
        if ((ushort *)local_80.super_LogMessage._0_8_ == (ushort *)0x0) {
          return (char *)(ushort *)0x0;
        }
        local_64 = local_84;
        pTVar4 = local_40[1].table;
        while (bVar6 = ParseContext::Done(ctx,(char **)&local_80), !bVar6) {
          uVar10 = (uint)pTVar4->fast_idx_mask & (uint)*(ushort *)local_80.super_LogMessage._0_8_;
          if ((uVar10 & 7) != 0) {
            protobuf_assumption_failed
                      ("(idx & 7) == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                       ,0x452);
          }
          uVar9 = (ulong)(uVar10 & 0xfffffff8);
          local_80.super_LogMessage._0_8_ =
               (**(code **)(&pTVar4[1].has_bits_offset + uVar9))
                         (s,local_80.super_LogMessage._0_8_,ctx,
                          (ulong)*(ushort *)local_80.super_LogMessage._0_8_ ^
                          *(ulong *)(&pTVar4[1].fast_idx_mask + uVar9 * 2),pTVar4);
          if (((ushort *)local_80.super_LogMessage._0_8_ == (ushort *)0x0) ||
             ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
        }
        if ((pTVar4->field_0x9 & 1) == 0) {
          puVar7 = (ushort *)local_80.super_LogMessage._0_8_;
          if ((ushort *)local_80.super_LogMessage._0_8_ == (ushort *)0x0) {
            VerifyHasBitConsistency((MessageLite *)s,pTVar4);
            puVar7 = (ushort *)local_80.super_LogMessage._0_8_;
            goto LAB_001cdbb8;
          }
LAB_001cda25:
          node = local_58;
          failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                  (iVar13,ctx->depth_,"old_depth == depth_");
          if (failure_msg != (Nullable<const_char_*>)0x0) {
            file = 
            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
            ;
            iVar13 = 0x481;
LAB_001cdce1:
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_80,file,iVar13,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_80);
          }
        }
        else {
          puVar7 = (ushort *)
                   (*pTVar4->post_loop_handler)
                             ((MessageLite *)s,(char *)local_80.super_LogMessage._0_8_,ctx);
LAB_001cdbb8:
          if (puVar7 != (ushort *)0x0) goto LAB_001cda25;
          puVar7 = (ushort *)0x0;
          node = local_58;
        }
        ctx->depth_ = ctx->depth_ + 1;
        local_5c.token_ = local_64;
        bVar6 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,&local_5c);
        local_98 = puVar7;
        if (!bVar6) {
          return (char *)(ushort *)0x0;
        }
        goto joined_r0x001cdb3c;
      }
      size = ReadSize((char **)&local_98);
      if (local_98 == (ushort *)0x0) {
        return (char *)(ushort *)0x0;
      }
      local_98 = (ushort *)
                 EpsCopyInputStream::ReadString
                           (&ctx->super_EpsCopyInputStream,(char *)local_98,size,s);
      if (local_98 == (ushort *)0x0) {
        return (char *)(ushort *)0x0;
      }
      bVar6 = MapTypeCard::is_utf8(&local_8a);
      if ((bVar6 && (iVar5 & 0xc) != 0) &&
         (sVar16._M_str = extraout_RDX, sVar16._M_len = (size_t)(s->_M_dataplus)._M_p,
         bVar6 = utf8_range::IsStructurallyValid((utf8_range *)s->_M_string_length,sVar16),
         pTVar4 = local_50, !bVar6)) {
        sVar16 = MessageName(local_50);
        sVar17 = FieldName(pTVar4,local_48);
        message_name._M_str = (char *)sVar17._M_len;
        message_name._M_len = (size_t)sVar16._M_str;
        field_name._M_str = "parsing";
        field_name._M_len = (size_t)sVar17._M_str;
        PrintUTF8ErrorLog((internal *)sVar16._M_len,message_name,field_name,(char *)0x0,
                          (bool)in_stack_ffffffffffffff58);
        if ((iVar5 & 4) != 0) {
          return (char *)(ushort *)0x0;
        }
      }
      break;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0xafe);
    case 5:
      uVar3 = *(undefined4 *)local_98;
      local_98 = local_98 + 2;
      *(undefined4 *)&(s->_M_dataplus)._M_p = uVar3;
    }
  } while( true );
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, UntypedMapBase& map) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = map_info.key_type_card.tag();
  const uint8_t value_tag = map_info.value_type_card.tag();

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    UntypedMapBase::TypeKind type_kind;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      type_kind = map.type_info().key_type_kind();
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      type_kind = map.type_info().value_type_kind();
      obj = map.GetVoidValue(node);
    }

    switch (inner_tag & 7) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_kind) {
          case UntypedMapBase::TypeKind::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case UntypedMapBase::TypeKind::kU32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case UntypedMapBase::TypeKind::kU64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_kind == UntypedMapBase::TypeKind::kString) {
          const int size = ReadSize(&ptr);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(static_cast<int>(type_kind),
                         static_cast<int>(UntypedMapBase::TypeKind::kMessage));
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
            return ParseLoop(reinterpret_cast<MessageLite*>(obj), ptr, ctx,
                             aux[1].table);
          });
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}